

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RepairCompletePdu.cpp
# Opt level: O0

bool __thiscall DIS::RepairCompletePdu::operator==(RepairCompletePdu *this,RepairCompletePdu *rhs)

{
  bool bVar1;
  bool local_19;
  bool ivarsEqual;
  RepairCompletePdu *rhs_local;
  RepairCompletePdu *this_local;
  
  local_19 = LogisticsFamilyPdu::operator==
                       (&this->super_LogisticsFamilyPdu,&rhs->super_LogisticsFamilyPdu);
  bVar1 = EntityID::operator==(&this->_receivingEntityID,&rhs->_receivingEntityID);
  if (!bVar1) {
    local_19 = false;
  }
  bVar1 = EntityID::operator==(&this->_repairingEntityID,&rhs->_repairingEntityID);
  if (!bVar1) {
    local_19 = false;
  }
  if (this->_repair != rhs->_repair) {
    local_19 = false;
  }
  if (this->_padding2 != rhs->_padding2) {
    local_19 = false;
  }
  return local_19;
}

Assistant:

bool RepairCompletePdu::operator ==(const RepairCompletePdu& rhs) const
 {
     bool ivarsEqual = true;

     ivarsEqual = LogisticsFamilyPdu::operator==(rhs);

     if( ! (_receivingEntityID == rhs._receivingEntityID) ) ivarsEqual = false;
     if( ! (_repairingEntityID == rhs._repairingEntityID) ) ivarsEqual = false;
     if( ! (_repair == rhs._repair) ) ivarsEqual = false;
     if( ! (_padding2 == rhs._padding2) ) ivarsEqual = false;

    return ivarsEqual;
 }